

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::~cmGlobalNinjaGenerator(cmGlobalNinjaGenerator *this)

{
  ~cmGlobalNinjaGenerator(this);
  operator_delete(this,0x730);
  return;
}

Assistant:

virtual ~cmGlobalNinjaGenerator() { }